

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O0

int run_benchmark_pipe_pound_100(void)

{
  int iVar1;
  
  iVar1 = pound_it(100,"pipe",pipe_do_setup,pipe_do_connect,pipe_make_connect,(void *)0x0);
  return iVar1;
}

Assistant:

BENCHMARK_IMPL(pipe_pound_100) {
  return pound_it(100,
                  "pipe",
                  pipe_do_setup,
                  pipe_do_connect,
                  pipe_make_connect,
                  NULL);
}